

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_util.cpp
# Opt level: O2

Vector<double,_std::allocator<double>_> *
amrex::VectorMax(Vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mfs,
                IntVect *param_2,int sComp,int nComp,int nGrow)

{
  double dVar1;
  pointer pdVar2;
  int n;
  int i;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  Real RVar6;
  allocator_type local_3d;
  int local_3c;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *local_38;
  
  local_3c = nGrow;
  local_38 = mfs;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->super_vector<double,_std::allocator<double>_>,(long)nComp,
             &local_3d);
  uVar3 = 0;
  uVar5 = (ulong)(uint)nComp;
  if (nComp < 1) {
    uVar5 = uVar3;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    RVar6 = MultiFab::max(*(local_38->
                           super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ).
                           super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,sComp + (int)uVar3,local_3c,
                          false);
    (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar3] = RVar6;
  }
  for (lVar4 = 1;
      lVar4 < (long)(local_38->
                    super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>)
                    .
                    super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_38->
                    super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>)
                    .
                    super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3; lVar4 = lVar4 + 1) {
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      pdVar2 = (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      RVar6 = MultiFab::max((local_38->
                            super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                            ).
                            super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar4],sComp + (int)uVar3,
                            local_3c,false);
      dVar1 = pdVar2[uVar3];
      if (RVar6 <= dVar1) {
        RVar6 = dVar1;
      }
      (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar3] = RVar6;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Real>
  VectorMax(const Vector<const MultiFab *>& mfs,
            const IntVect&                  /*tilesize*/,
            int                             sComp,
            int                             nComp,
            int                             nGrow)
  {
    Vector<Real> gMax(nComp);

    for (int n=0; n<nComp; ++n) {
        gMax[n] = mfs[0]->max(sComp+n,nGrow);
    }

    for (int i=1; i<mfs.size(); ++i) {

      for (int n=0; n<nComp; ++n) {
        gMax[n] = std::max(gMax[n], mfs[i]->max(sComp+n,nGrow));
      }
    }

    return gMax;
  }